

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint crnlib::symbol_codec::encode_truncated_binary_cost(uint v,uint n)

{
  uint in_ESI;
  uint in_EDI;
  uint u;
  uint k;
  undefined4 local_4;
  
  local_4 = math::floor_log2i(in_ESI);
  if ((1 << ((char)local_4 + 1U & 0x1f)) - in_ESI <= in_EDI) {
    local_4 = local_4 + 1;
  }
  return local_4;
}

Assistant:

uint symbol_codec::encode_truncated_binary_cost(uint v, uint n) {
  CRNLIB_ASSERT((n >= 2) && (v < n));

  uint k = math::floor_log2i(n);
  uint u = (1 << (k + 1)) - n;

  if (v < u)
    return k;
  else
    return k + 1;
}